

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase223::run(TestCase223 *this)

{
  word **this_00;
  bool bVar1;
  uchar *puVar2;
  Orphan<capnp::Data> *value;
  BuilderFor<capnp::Data> BVar3;
  Builder BVar4;
  ArrayPtr<unsigned_char> AVar5;
  ArrayPtr<unsigned_char> local_318;
  uint local_308;
  bool local_301;
  undefined1 auStack_300 [7];
  bool _kj_shouldLog_1;
  size_t local_2f8;
  uint local_2f0;
  DebugExpression<unsigned_int> local_2ec;
  undefined1 local_2e8 [8];
  DebugComparison<unsigned_int,_unsigned_char_&> _kjCondition_3;
  uint local_2b0;
  bool local_2a9;
  undefined1 auStack_2a8 [7];
  bool _kj_shouldLog;
  size_t local_2a0;
  uint local_298;
  DebugExpression<unsigned_int> local_294;
  undefined1 local_290 [8];
  DebugComparison<unsigned_int,_unsigned_char_&> _kjCondition_2;
  size_t local_258;
  uint local_24c;
  Fault local_248;
  Fault f_1;
  size_t local_230;
  uint local_228;
  DebugExpression<unsigned_int> local_224;
  undefined1 local_220 [8];
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition_1;
  Builder root;
  ArrayPtr<unsigned_char> local_1c0;
  ArrayPtr<unsigned_char> local_1b0;
  size_t local_1a0;
  uint local_194;
  Fault local_190;
  Fault f;
  size_t local_178;
  uint local_170;
  DebugExpression<unsigned_int> local_16c;
  undefined1 local_168 [8];
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  Orphanage local_130;
  undefined1 local_120 [8];
  Orphan<capnp::Data> orphan;
  MallocMessageBuilder builder;
  TestCase223 *this_local;
  
  this_00 = &orphan.builder.location;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  local_130 = MessageBuilder::getOrphanage((MessageBuilder *)this_00);
  Orphanage::newOrphan<capnp::Data>((Orphan<capnp::Data> *)local_120,&local_130,2);
  local_170 = 2;
  local_16c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_170);
  BVar3 = Orphan<capnp::Data>::get((Orphan<capnp::Data> *)local_120);
  f.exception = (Exception *)BVar3.super_ArrayPtr<unsigned_char>.ptr;
  local_178 = kj::ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&f);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_long> *)local_168,&local_16c,&local_178);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_168);
  if (!bVar1) {
    local_194 = 2;
    local_1b0 = (ArrayPtr<unsigned_char>)Orphan<capnp::Data>::get((Orphan<capnp::Data> *)local_120);
    local_1a0 = kj::ArrayPtr<unsigned_char>::size(&local_1b0);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0xe3,FAILED,"(2u) == (orphan.get().size())","_kjCondition,2u, orphan.get().size()",
               (DebugComparison<unsigned_int,_unsigned_long> *)local_168,&local_194,&local_1a0);
    kj::_::Debug::Fault::fatal(&local_190);
  }
  local_1c0 = (ArrayPtr<unsigned_char>)Orphan<capnp::Data>::get((Orphan<capnp::Data> *)local_120);
  puVar2 = kj::ArrayPtr<unsigned_char>::operator[](&local_1c0,0);
  *puVar2 = '{';
  BVar3 = Orphan<capnp::Data>::get((Orphan<capnp::Data> *)local_120);
  root._builder._32_8_ = BVar3.super_ArrayPtr<unsigned_char>.ptr;
  puVar2 = kj::ArrayPtr<unsigned_char>::operator[]
                     ((ArrayPtr<unsigned_char> *)&root._builder.dataSize,1);
  *puVar2 = '-';
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)&_kjCondition_1.result,(MessageBuilder *)&orphan.builder.location);
  value = kj::mv<capnp::Orphan<capnp::Data>>((Orphan<capnp::Data> *)local_120);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptDataField
            ((Builder *)&_kjCondition_1.result,value);
  local_228 = 2;
  local_224 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_228);
  BVar4 = capnproto_test::capnp::test::TestAllTypes::Builder::getDataField
                    ((Builder *)&_kjCondition_1.result);
  f_1.exception = (Exception *)BVar4.super_ArrayPtr<unsigned_char>.ptr;
  local_230 = kj::ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&f_1);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_long> *)local_220,&local_224,&local_230);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_220);
  if (bVar1) {
    local_298 = 0x7b;
    local_294 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_298);
    _auStack_2a8 = (ArrayPtr<unsigned_char>)
                   capnproto_test::capnp::test::TestAllTypes::Builder::getDataField
                             ((Builder *)&_kjCondition_1.result);
    puVar2 = kj::ArrayPtr<unsigned_char>::operator[]((ArrayPtr<unsigned_char> *)auStack_2a8,0);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_char_&> *)local_290,&local_294,puVar2);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_290);
    if (!bVar1) {
      local_2a9 = kj::_::Debug::shouldLog(ERROR);
      while (local_2a9 != false) {
        local_2b0 = 0x7b;
        BVar4 = capnproto_test::capnp::test::TestAllTypes::Builder::getDataField
                          ((Builder *)&_kjCondition_1.result);
        _kjCondition_3._32_8_ = BVar4.super_ArrayPtr<unsigned_char>.ptr;
        puVar2 = kj::ArrayPtr<unsigned_char>::operator[]
                           ((ArrayPtr<unsigned_char> *)&_kjCondition_3.result,0);
        kj::_::Debug::
        log<char_const(&)[52],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0xea,ERROR,
                   "\"failed: expected \" \"(123u) == (root.getDataField()[0])\", _kjCondition, 123u, root.getDataField()[0]"
                   ,(char (*) [52])"failed: expected (123u) == (root.getDataField()[0])",
                   (DebugComparison<unsigned_int,_unsigned_char_&> *)local_290,&local_2b0,puVar2);
        local_2a9 = false;
      }
    }
    local_2f0 = 0x2d;
    local_2ec = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2f0);
    _auStack_300 = (ArrayPtr<unsigned_char>)
                   capnproto_test::capnp::test::TestAllTypes::Builder::getDataField
                             ((Builder *)&_kjCondition_1.result);
    puVar2 = kj::ArrayPtr<unsigned_char>::operator[]((ArrayPtr<unsigned_char> *)auStack_300,1);
    kj::_::DebugExpression<unsigned_int>::operator==
              ((DebugComparison<unsigned_int,_unsigned_char_&> *)local_2e8,&local_2ec,puVar2);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2e8);
    if (!bVar1) {
      local_301 = kj::_::Debug::shouldLog(ERROR);
      while (local_301 != false) {
        local_308 = 0x2d;
        AVar5 = (ArrayPtr<unsigned_char>)
                capnproto_test::capnp::test::TestAllTypes::Builder::getDataField
                          ((Builder *)&_kjCondition_1.result);
        local_318 = AVar5;
        puVar2 = kj::ArrayPtr<unsigned_char>::operator[](&local_318,1);
        kj::_::Debug::
        log<char_const(&)[51],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0xeb,ERROR,
                   "\"failed: expected \" \"(45u) == (root.getDataField()[1])\", _kjCondition, 45u, root.getDataField()[1]"
                   ,(char (*) [51])"failed: expected (45u) == (root.getDataField()[1])",
                   (DebugComparison<unsigned_int,_unsigned_char_&> *)local_2e8,&local_308,puVar2);
        local_301 = false;
      }
    }
    Orphan<capnp::Data>::~Orphan((Orphan<capnp::Data> *)local_120);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&orphan.builder.location);
    return;
  }
  local_24c = 2;
  BVar4 = capnproto_test::capnp::test::TestAllTypes::Builder::getDataField
                    ((Builder *)&_kjCondition_1.result);
  _kjCondition_2._32_8_ = BVar4.super_ArrayPtr<unsigned_char>.ptr;
  local_258 = kj::ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&_kjCondition_2.result);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
            (&local_248,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
             ,0xe9,FAILED,"(2u) == (root.getDataField().size())",
             "_kjCondition,2u, root.getDataField().size()",
             (DebugComparison<unsigned_int,_unsigned_long> *)local_220,&local_24c,&local_258);
  kj::_::Debug::Fault::fatal(&local_248);
}

Assistant:

TEST(Orphans, OrphanageData) {
  MallocMessageBuilder builder;

  Orphan<Data> orphan = builder.getOrphanage().newOrphan<Data>(2);
  ASSERT_EQ(2u, orphan.get().size());
  orphan.get()[0] = 123;
  orphan.get()[1] = 45;

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptDataField(kj::mv(orphan));
  ASSERT_EQ(2u, root.getDataField().size());
  EXPECT_EQ(123u, root.getDataField()[0]);
  EXPECT_EQ(45u, root.getDataField()[1]);
}